

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecWec.h
# Opt level: O3

void Vec_WecFree(Vec_Wec_t *p)

{
  void *__ptr;
  int iVar1;
  Vec_Int_t *__ptr_00;
  long lVar2;
  long lVar3;
  
  iVar1 = p->nCap;
  __ptr_00 = p->pArray;
  if (iVar1 < 1) {
    if (__ptr_00 == (Vec_Int_t *)0x0) goto LAB_0066bbb3;
  }
  else {
    lVar2 = 8;
    lVar3 = 0;
    do {
      __ptr = *(void **)((long)&__ptr_00->nCap + lVar2);
      if (__ptr != (void *)0x0) {
        free(__ptr);
        __ptr_00 = p->pArray;
        *(undefined8 *)((long)&__ptr_00->nCap + lVar2) = 0;
        iVar1 = p->nCap;
      }
      lVar3 = lVar3 + 1;
      lVar2 = lVar2 + 0x10;
    } while (lVar3 < iVar1);
  }
  free(__ptr_00);
LAB_0066bbb3:
  free(p);
  return;
}

Assistant:

static inline void Vec_WecFree( Vec_Wec_t * p )
{
    Vec_WecErase( p );
    ABC_FREE( p );
}